

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actor.h
# Opt level: O0

void __thiscall AActor::RestoreDamage(AActor *this)

{
  AActor *pAVar1;
  AActor *this_local;
  
  pAVar1 = GetDefault(this);
  this->DamageVal = pAVar1->DamageVal;
  pAVar1 = GetDefault(this);
  this->DamageFunc = pAVar1->DamageFunc;
  return;
}

Assistant:

void RestoreDamage()
	{
		DamageVal = GetDefault()->DamageVal;
		DamageFunc = GetDefault()->DamageFunc;
	}